

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O2

pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
* __thiscall
QFlatMap<QPushButton*,QDialogButtonBox::StandardButton,std::less<QPushButton*>,QVarLengthArray<QPushButton*,8ll>,QVarLengthArray<QDialogButtonBox::StandardButton,8ll>>
::try_emplace<QDialogButtonBox::StandardButton_const&>
          (pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,QPushButton **key,StandardButton *args)

{
  containers *pcVar1;
  iterator ppQVar2;
  bool bVar3;
  long lVar4;
  iterator iVar5;
  
  iVar5 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
          ::lower_bound((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                         *)this,key);
  lVar4 = iVar5.i;
  pcVar1 = iVar5.c;
  if (((pcVar1 == (containers *)this) && (lVar4 == *(long *)((long)this + 8))) ||
     (*key < *(QPushButton **)
              ((long)(pcVar1->keys).super_QVLABase<QPushButton_*>.super_QVLABaseBase.ptr + lVar4 * 8
              ))) {
    QVarLengthArray<QDialogButtonBox::StandardButton,8ll>::
    emplace<QDialogButtonBox::StandardButton_const&>
              ((QVarLengthArray<QDialogButtonBox::StandardButton,8ll> *)((long)this + 0x58),
               (const_iterator)(lVar4 * 4 + *(long *)((long)this + 0x68)),args);
    ppQVar2 = QVarLengthArray<QPushButton_*,_8LL>::insert
                        ((QVarLengthArray<QPushButton_*,_8LL> *)this,
                         (const_iterator)(lVar4 * 8 + *(long *)((long)this + 0x10)),key);
    lVar4 = (long)ppQVar2 - *(long *)((long)this + 0x10) >> 3;
    bVar3 = true;
    pcVar1 = (containers *)this;
  }
  else {
    bVar3 = false;
  }
  (__return_storage_ptr__->first).c = pcVar1;
  (__return_storage_ptr__->first).i = lVar4;
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }